

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndarray.h
# Opt level: O2

size_t tvm::runtime::GetDataSize(DLTensor *arr)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar1 = (ulong)(uint)arr->ndim;
  if (arr->ndim < 1) {
    uVar1 = uVar3;
  }
  lVar2 = 1;
  for (; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    lVar2 = lVar2 * arr->shape[uVar3];
  }
  return (ulong)((uint)(arr->dtype).lanes * (uint)(arr->dtype).bits + 7 >> 3) * lVar2;
}

Assistant:

inline size_t GetDataSize(const DLTensor &arr) {
  size_t size = 1;
  for (tvm_index_t i = 0; i < arr.ndim; ++i) {
    size *= static_cast<size_t>(arr.shape[i]);
  }
  size *= (arr.dtype.bits * arr.dtype.lanes + 7) / 8;
  return size;
}